

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
::
key_value<jsoncons::byte_string_arg_t_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,int>
          (key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
           *this,key_type *name,byte_string_arg_t *args,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *args_1,int *args_2)

{
  undefined1 local_19;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  basic_json<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)(this + 0x20),args_1,
             (long)*args_2,&local_19,0);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }